

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

int yy_braces(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int yythunkpos19;
  int yypos19;
  int yythunkpos18;
  int yypos18;
  int yythunkpos17;
  int yypos17;
  int yythunkpos14;
  int yypos14;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar9 = G->pos;
  iVar3 = G->thunkpos;
  iVar6 = yymatchChar(G,0x7b);
  if (iVar6 == 0) {
LAB_00104a0e:
    G->pos = iVar9;
    G->thunkpos = iVar3;
    iVar9 = G->pos;
    iVar3 = G->thunkpos;
    iVar6 = yymatchChar(G,0x7d);
    if (iVar6 == 0) {
      G->pos = iVar9;
      G->thunkpos = iVar3;
      iVar9 = yymatchDot(G);
      if (iVar9 != 0) goto LAB_00104a73;
    }
    G->pos = iVar1;
    G->thunkpos = iVar2;
    G_local._4_4_ = 0;
  }
  else {
    do {
      iVar6 = G->pos;
      iVar4 = G->thunkpos;
      iVar8 = G->pos;
      iVar5 = G->thunkpos;
      iVar7 = yymatchChar(G,0x7d);
      if (iVar7 != 0) break;
      G->pos = iVar8;
      G->thunkpos = iVar5;
      iVar8 = yymatchDot(G);
    } while (iVar8 != 0);
    G->pos = iVar6;
    G->thunkpos = iVar4;
    iVar6 = yymatchChar(G,0x7d);
    if (iVar6 == 0) goto LAB_00104a0e;
LAB_00104a73:
    G_local._4_4_ = 1;
  }
  return G_local._4_4_;
}

Assistant:

YY_RULE(int) yy_braces(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "braces"));

  {  int yypos14= G->pos, yythunkpos14= G->thunkpos;  if (!yymatchChar(G, '{')) goto l15;

  l16:;	
  {  int yypos17= G->pos, yythunkpos17= G->thunkpos;
  {  int yypos18= G->pos, yythunkpos18= G->thunkpos;  if (!yymatchChar(G, '}')) goto l18;
  goto l17;
  l18:;	  G->pos= yypos18; G->thunkpos= yythunkpos18;
  }  if (!yymatchDot(G)) goto l17;  goto l16;
  l17:;	  G->pos= yypos17; G->thunkpos= yythunkpos17;
  }  if (!yymatchChar(G, '}')) goto l15;
  goto l14;
  l15:;	  G->pos= yypos14; G->thunkpos= yythunkpos14;
  {  int yypos19= G->pos, yythunkpos19= G->thunkpos;  if (!yymatchChar(G, '}')) goto l19;
  goto l13;
  l19:;	  G->pos= yypos19; G->thunkpos= yythunkpos19;
  }  if (!yymatchDot(G)) goto l13;
  }
  l14:;	  yyprintf((stderr, "  ok   braces"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l13:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "braces"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}